

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_memory_block_manager.hpp
# Opt level: O2

bool __thiscall
duckdb::InMemoryBlockManager::IsRootBlock(InMemoryBlockManager *this,MetaBlockPointer root)

{
  InternalException *this_00;
  allocator local_39;
  string local_38;
  
  this_00 = (InternalException *)__cxa_allocate_exception(0x10,root.block_pointer,root._8_8_);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Cannot perform IO in in-memory database - IsRootBlock!",&local_39)
  ;
  InternalException::InternalException(this_00,&local_38);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

bool IsRootBlock(MetaBlockPointer root) override {
		throw InternalException("Cannot perform IO in in-memory database - IsRootBlock!");
	}